

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O0

_Bool bitset_contains_all(bitset_t *b1,bitset_t *b2)

{
  _Bool _Var1;
  bitset_t *in_RSI;
  long *in_RDI;
  size_t k;
  size_t min_size;
  ulong local_28;
  ulong local_20;
  _Bool local_1;
  
  local_20 = in_RDI[1];
  if (in_RSI->arraysize < (ulong)in_RDI[1]) {
    local_20 = in_RSI->arraysize;
  }
  local_28 = 0;
  while( true ) {
    if (local_20 <= local_28) {
      if ((ulong)in_RDI[1] < in_RSI->arraysize) {
        _Var1 = any_bits_set(in_RSI,in_RDI[1]);
        local_1 = (_Bool)((_Var1 ^ 0xffU) & 1);
      }
      else {
        local_1 = true;
      }
      return local_1;
    }
    if ((*(ulong *)(*in_RDI + local_28 * 8) & in_RSI->array[local_28]) != in_RSI->array[local_28])
    break;
    local_28 = local_28 + 1;
  }
  return false;
}

Assistant:

bool bitset_contains_all(const bitset_t * CBITSET_RESTRICT b1, const bitset_t * CBITSET_RESTRICT b2) {
  size_t min_size = b1->arraysize;
  if(b1->arraysize > b2->arraysize) {
    min_size = b2->arraysize;
  }
  for(size_t k = 0; k < min_size; k++) {
    if((b1->array[k] & b2->array[k]) != b2->array[k]) {
      return false;
    }
  }
  if(b2->arraysize > b1->arraysize) {
    /* Need to check if b2 has any bits set beyond b1's array */
    return !any_bits_set(b2, b1->arraysize);
  }
  return true;
}